

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

void __thiscall
flatbuffers::go::GoGenerator::GenNativeTableUnPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  FieldDef *pFVar5;
  EnumDef *pEVar6;
  StructDef *def;
  pointer pcVar7;
  string *psVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  size_type *psVar12;
  long *plVar13;
  undefined8 uVar14;
  ulong uVar15;
  _Alloc_hider _Var16;
  pointer ppFVar17;
  string field_table;
  string field_field;
  string field_var;
  string length;
  string struct_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  StructDef *local_c0;
  string local_b8;
  GoGenerator *local_98;
  long *local_90 [2];
  long local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  local_188 = code_ptr;
  local_c0 = struct_def;
  local_98 = this;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,pIVar1);
  std::operator+(&local_1e8,"func (rcv *",&local_50);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  paVar2 = &local_120.field_2;
  puVar11 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_120.field_2._M_allocated_capacity = *puVar11;
    local_120.field_2._8_4_ = (undefined4)plVar9[3];
    local_120.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_120._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar11;
    local_120._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_120._M_string_length = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_1c8,pIVar1,local_c0);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    uVar14 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1c8._M_string_length + local_120._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      uVar14 = local_1c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_1c8._M_string_length + local_120._M_string_length) goto LAB_00207432;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
  }
  else {
LAB_00207432:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1c8._M_dataplus._M_p);
  }
  local_140 = &local_130;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_130 = *plVar9;
    lStack_128 = puVar10[3];
  }
  else {
    local_130 = *plVar9;
    local_140 = (long *)*puVar10;
  }
  local_138 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar9[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_160._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_160._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  ppFVar17 = (local_c0->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar17 !=
      (local_c0->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pFVar5 = *ppFVar17;
      if (pFVar5->deprecated == false) {
        (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_160,pIVar1,pFVar5);
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_140,pIVar1,pFVar5);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,local_140,(undefined1 *)(local_138 + (long)local_140));
        std::__cxx11::string::append((char *)&local_120);
        BVar4 = (pFVar5->value).type.base_type;
        if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
          pEVar6 = (pFVar5->value).type.enum_def;
          if ((pEVar6 == (EnumDef *)0x0) || (pEVar6->is_union == false)) {
            std::operator+(&local_180,"\tt.",&local_160);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1a8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1c8._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1e8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
            goto LAB_00208d5c;
          }
        }
        else {
          switch(BVar4) {
          case BASE_TYPE_STRING:
            std::operator+(&local_180,"\tt.",&local_160);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1c8._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1e8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
            break;
          case BASE_TYPE_VECTOR:
          case BASE_TYPE_VECTOR64:
            if (((pFVar5->value).type.element != BASE_TYPE_UCHAR) ||
               ((pFVar5->value).type.enum_def != (EnumDef *)0x0)) {
              std::operator+(&local_180,"\t",&local_120);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_180);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1a8.field_2._M_allocated_capacity = *psVar12;
                local_1a8.field_2._8_8_ = plVar9[3];
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar12;
                local_1a8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1a8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1c8.field_2._M_allocated_capacity = *psVar12;
                local_1c8.field_2._8_8_ = plVar9[3];
              }
              else {
                local_1c8.field_2._M_allocated_capacity = *psVar12;
                local_1c8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1c8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8.field_2._8_8_ = plVar9[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1e8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_e0,"\tt.",&local_160);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
              local_100 = &local_f0;
              puVar11 = puVar10 + 2;
              if ((ulong *)*puVar10 == puVar11) {
                local_f0 = *puVar11;
                lStack_e8 = puVar10[3];
              }
              else {
                local_f0 = *puVar11;
                local_100 = (ulong *)*puVar10;
              }
              local_f8 = puVar10[1];
              *puVar10 = puVar11;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              NativeType_abi_cxx11_(&local_b8,local_98,&(pFVar5->value).type);
              uVar15 = 0xf;
              if (local_100 != &local_f0) {
                uVar15 = local_f0;
              }
              if (uVar15 < local_b8._M_string_length + local_f8) {
                uVar14 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  uVar14 = local_b8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar14 < local_b8._M_string_length + local_f8) goto LAB_00207be3;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_b8,0,(char *)0x0,(ulong)local_100);
              }
              else {
LAB_00207be3:
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_100,(ulong)local_b8._M_dataplus._M_p);
              }
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              psVar12 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_180.field_2._M_allocated_capacity = *psVar12;
                local_180.field_2._8_8_ = puVar10[3];
              }
              else {
                local_180.field_2._M_allocated_capacity = *psVar12;
                local_180._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_180._M_string_length = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)psVar12 = 0;
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              psVar12 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1a8.field_2._M_allocated_capacity = *psVar12;
                local_1a8.field_2._8_8_ = puVar10[3];
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar12;
                local_1a8._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_1a8._M_string_length = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_1a8,(ulong)local_120._M_dataplus._M_p);
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              puVar11 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar11) {
                local_1c8.field_2._M_allocated_capacity = *puVar11;
                local_1c8.field_2._8_8_ = puVar10[3];
              }
              else {
                local_1c8.field_2._M_allocated_capacity = *puVar11;
                local_1c8._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_1c8._M_string_length = puVar10[1];
              *puVar10 = puVar11;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8.field_2._8_8_ = plVar9[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1e8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_100 != &local_f0) {
                operator_delete(local_100,local_f0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              std::operator+(&local_1c8,"\tfor j := 0; j < ",&local_120);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8.field_2._8_8_ = plVar9[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1e8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((pFVar5->value).type.element == BASE_TYPE_STRUCT) {
                def = (pFVar5->value).type.struct_def;
                WrapInNameSpaceAndTrack(&local_1a8,local_98,&def->super_Definition,(string *)def);
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x36be20);
                local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                puVar11 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar11) {
                  local_1c8.field_2._M_allocated_capacity = *puVar11;
                  local_1c8.field_2._8_8_ = puVar10[3];
                }
                else {
                  local_1c8.field_2._M_allocated_capacity = *puVar11;
                  local_1c8._M_dataplus._M_p = (pointer)*puVar10;
                }
                local_1c8._M_string_length = puVar10[1];
                *puVar10 = puVar11;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                psVar12 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_1e8.field_2._M_allocated_capacity = *psVar12;
                  local_1e8.field_2._8_8_ = plVar9[3];
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = *psVar12;
                  local_1e8._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_1e8._M_string_length = plVar9[1];
                *plVar9 = (long)psVar12;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_1c8,"\t\trcv.",&local_160);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                psVar12 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_1e8.field_2._M_allocated_capacity = *psVar12;
                  local_1e8.field_2._8_8_ = plVar9[3];
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = *psVar12;
                  local_1e8._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_1e8._M_string_length = plVar9[1];
                *plVar9 = (long)psVar12;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
              }
              std::operator+(&local_1c8,"\t\tt.",&local_160);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              psVar12 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8.field_2._8_8_ = puVar10[3];
              }
              else {
                local_1e8.field_2._M_allocated_capacity = *psVar12;
                local_1e8._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_1e8._M_string_length = puVar10[1];
              *puVar10 = psVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              BVar4 = (pFVar5->value).type.element;
              if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
                std::operator+(&local_1c8,"rcv.",&local_160);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                psVar12 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_1e8.field_2._M_allocated_capacity = *psVar12;
                  local_1e8.field_2._8_8_ = puVar10[3];
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = *psVar12;
                  local_1e8._M_dataplus._M_p = (pointer)*puVar10;
                }
                local_1e8._M_string_length = puVar10[1];
                *puVar10 = psVar12;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p)
                ;
LAB_00208c18:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                if (BVar4 != BASE_TYPE_STRUCT) {
                  if (BVar4 != BASE_TYPE_STRING) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                                  ,0x4f0,
                                  "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                                 );
                  }
                  std::operator+(&local_1c8,"string(rcv.",&local_160);
                  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
                  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                  psVar12 = puVar10 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar12) {
                    local_1e8.field_2._M_allocated_capacity = *psVar12;
                    local_1e8.field_2._8_8_ = puVar10[3];
                  }
                  else {
                    local_1e8.field_2._M_allocated_capacity = *psVar12;
                    local_1e8._M_dataplus._M_p = (pointer)*puVar10;
                  }
                  local_1e8._M_string_length = puVar10[1];
                  *puVar10 = psVar12;
                  puVar10[1] = 0;
                  *(undefined1 *)(puVar10 + 2) = 0;
                  std::__cxx11::string::_M_append
                            ((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
                  goto LAB_00208c18;
                }
                std::__cxx11::string::append((char *)local_188);
              }
              std::__cxx11::string::append((char *)local_188);
              std::__cxx11::string::append((char *)local_188);
              goto LAB_00208dcb;
            }
            std::operator+(&local_180,"\tt.",&local_160);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1c8._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1e8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
            break;
          case BASE_TYPE_STRUCT:
            std::operator+(&local_180,"\tt.",&local_160);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1c8._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *psVar12;
              local_1e8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1e8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1e8._M_dataplus._M_p);
            break;
          case BASE_TYPE_UNION:
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e8,local_140,(undefined1 *)(local_138 + (long)local_140));
            std::__cxx11::string::append((char *)&local_1e8);
            std::operator+(&local_1a8,"\t",&local_1e8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1c8.field_2._M_allocated_capacity = *psVar12;
              local_1c8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *psVar12;
              local_1c8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1c8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            (*(pIVar1->super_Namer)._vptr_Namer[4])(&local_e0,pIVar1,pFVar5);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x36bed2);
            local_100 = &local_f0;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar11) {
              local_f0 = *puVar11;
              lStack_e8 = plVar9[3];
            }
            else {
              local_f0 = *puVar11;
              local_100 = (ulong *)*plVar9;
            }
            local_f8 = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_180.field_2._M_allocated_capacity = *psVar12;
              local_180.field_2._8_8_ = plVar9[3];
            }
            else {
              local_180.field_2._M_allocated_capacity = *psVar12;
              local_180._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_180._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_180,(ulong)local_1e8._M_dataplus._M_p);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1a8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1c8.field_2._M_allocated_capacity = *psVar12;
              local_1c8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *psVar12;
              local_1c8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_1c8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_100 != &local_f0) {
              operator_delete(local_100,local_f0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            std::operator+(&local_b8,"\t\tt.",&local_160);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            puVar11 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_e0.field_2._M_allocated_capacity = *puVar11;
              local_e0.field_2._8_4_ = (undefined4)plVar9[3];
              local_e0.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
            }
            else {
              local_e0.field_2._M_allocated_capacity = *puVar11;
              local_e0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_e0._M_string_length = plVar9[1];
            *plVar9 = (long)puVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            local_90[0] = local_80;
            pcVar7 = (pFVar5->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar7,
                       pcVar7 + (pFVar5->super_Definition).name._M_string_length);
            std::__cxx11::string::append((char *)local_90);
            (*(local_98->namer_).super_Namer._vptr_Namer[0x14])
                      (&local_70,pIVar1,(string *)local_90,
                       (ulong)(local_98->namer_).super_Namer.config_.methods);
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              uVar14 = local_e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_68 + local_e0._M_string_length) {
              uVar15 = 0xf;
              if (local_70 != local_60) {
                uVar15 = local_60[0];
              }
              if (uVar15 < local_68 + local_e0._M_string_length) goto LAB_002085b2;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_70,0,(char *)0x0,(ulong)local_e0._M_dataplus._M_p);
            }
            else {
LAB_002085b2:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_70);
            }
            local_100 = &local_f0;
            puVar11 = puVar10 + 2;
            if ((ulong *)*puVar10 == puVar11) {
              local_f0 = *puVar11;
              lStack_e8 = puVar10[3];
            }
            else {
              local_f0 = *puVar11;
              local_100 = (ulong *)*puVar10;
            }
            local_f8 = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)puVar11 = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_180.field_2._M_allocated_capacity = *psVar12;
              local_180.field_2._8_8_ = puVar10[3];
            }
            else {
              local_180.field_2._M_allocated_capacity = *psVar12;
              local_180._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_180._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_1e8._M_dataplus._M_p);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar12;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            puVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11) {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *puVar11;
              local_1c8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1c8._M_string_length = puVar10[1];
            *puVar10 = puVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_188,(ulong)local_1c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_100 != &local_f0) {
              operator_delete(local_100,local_f0 + 1);
            }
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)local_188);
            uVar14 = local_1e8.field_2._M_allocated_capacity;
            _Var16._M_p = local_1e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) goto LAB_00208dcb;
            goto LAB_00208dc3;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_go.cpp"
                          ,0x501,
                          "void flatbuffers::go::GoGenerator::GenNativeTableUnPack(const StructDef &, std::string *)"
                         );
          }
LAB_00208d5c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          uVar14 = local_180.field_2._M_allocated_capacity;
          _Var16._M_p = local_180._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
LAB_00208dc3:
            operator_delete(_Var16._M_p,uVar14 + 1);
          }
        }
LAB_00208dcb:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      ppFVar17 = ppFVar17 + 1;
    } while (ppFVar17 !=
             (local_c0->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)local_188);
  paVar2 = &local_120.field_2;
  paVar3 = &local_160.field_2;
  std::operator+(&local_1e8,"func (rcv *",&local_50);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_120.field_2._M_allocated_capacity = *puVar11;
    local_120.field_2._8_4_ = (undefined4)plVar9[3];
    local_120.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_120._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar11;
    local_120._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_120._M_string_length = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_1c8,pIVar1,local_c0);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    uVar14 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_1c8._M_string_length + local_120._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      uVar14 = local_1c8.field_2._M_allocated_capacity;
    }
    if (local_1c8._M_string_length + local_120._M_string_length <= (ulong)uVar14) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
      goto LAB_00208f6d;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_1c8._M_dataplus._M_p);
LAB_00208f6d:
  local_140 = &local_130;
  plVar9 = puVar10 + 2;
  if ((long *)*puVar10 == plVar9) {
    local_130 = *plVar9;
    lStack_128 = puVar10[3];
  }
  else {
    local_130 = *plVar9;
    local_140 = (long *)*puVar10;
  }
  local_138 = puVar10[1];
  *puVar10 = plVar9;
  puVar10[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar9[3];
    local_160._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_160._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_188,(ulong)local_160._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_188);
  (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_120,pIVar1,local_c0);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x36bf18);
  psVar8 = local_188;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_130 = *plVar13;
    lStack_128 = plVar9[3];
    local_140 = &local_130;
  }
  else {
    local_130 = *plVar13;
    local_140 = (long *)*plVar9;
  }
  local_138 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = plVar9[3];
    local_160._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_160._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_160._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar8);
  std::__cxx11::string::append((char *)psVar8);
  std::__cxx11::string::append((char *)psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenNativeTableUnPack(const StructDef &struct_def,
                            std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string struct_type = namer_.Type(struct_def);

    code += "func (rcv *" + struct_type + ") UnPackTo(t *" +
            NativeName(struct_def) + ") {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      const std::string field_field = namer_.Field(field);
      const std::string field_var = namer_.Variable(field);
      const std::string length = field_var + "Length";
      if (IsScalar(field.value.type.base_type)) {
        if (field.value.type.enum_def != nullptr &&
            field.value.type.enum_def->is_union)
          continue;
        code += "\tt." + field_field + " = rcv." + field_field + "()\n";
      } else if (IsString(field.value.type)) {
        code += "\tt." + field_field + " = string(rcv." + field_field + "())\n";
      } else if (IsVector(field.value.type) &&
                 field.value.type.element == BASE_TYPE_UCHAR &&
                 field.value.type.enum_def == nullptr) {
        code += "\tt." + field_field + " = rcv." + field_field + "Bytes()\n";
      } else if (IsVector(field.value.type)) {
        code += "\t" + length + " := rcv." + field_field + "Length()\n";
        code += "\tt." + field_field + " = make(" +
                NativeType(field.value.type) + ", " + length + ")\n";
        code += "\tfor j := 0; j < " + length + "; j++ {\n";
        if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "\t\tx := " +
                  WrapInNameSpaceAndTrack(field.value.type.struct_def,
                                          field.value.type.struct_def->name) +
                  "{}\n";
          code += "\t\trcv." + field_field + "(&x, j)\n";
        }
        code += "\t\tt." + field_field + "[j] = ";
        if (IsScalar(field.value.type.element)) {
          code += "rcv." + field_field + "(j)";
        } else if (field.value.type.element == BASE_TYPE_STRING) {
          code += "string(rcv." + field_field + "(j))";
        } else if (field.value.type.element == BASE_TYPE_STRUCT) {
          code += "x.UnPack()";
        } else {
          // TODO(iceboy): Support vector of unions.
          FLATBUFFERS_ASSERT(0);
        }
        code += "\n";
        code += "\t}\n";
      } else if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        code +=
            "\tt." + field_field + " = rcv." + field_field + "(nil).UnPack()\n";
      } else if (field.value.type.base_type == BASE_TYPE_UNION) {
        const std::string field_table = field_var + "Table";
        code += "\t" + field_table + " := flatbuffers.Table{}\n";
        code +=
            "\tif rcv." + namer_.Method(field) + "(&" + field_table + ") {\n";
        code += "\t\tt." + field_field + " = rcv." +
                namer_.Method(field.name + UnionTypeFieldSuffix()) +
                "().UnPack(" + field_table + ")\n";
        code += "\t}\n";
      } else {
        FLATBUFFERS_ASSERT(0);
      }
    }
    code += "}\n\n";

    code += "func (rcv *" + struct_type + ") UnPack() *" +
            NativeName(struct_def) + " {\n";
    code += "\tif rcv == nil {\n\t\treturn nil\n\t}\n";
    code += "\tt := &" + NativeName(struct_def) + "{}\n";
    code += "\trcv.UnPackTo(t)\n";
    code += "\treturn t\n";
    code += "}\n\n";
  }